

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Options.cpp
# Opt level: O0

int __thiscall smf::Options::getRegIndex(Options *this,string *optionName)

{
  bool bVar1;
  ostream *poVar2;
  pointer ppVar3;
  _Self local_30;
  _Self local_28;
  iterator it;
  string *optionName_local;
  Options *this_local;
  
  it._M_node = (_Base_ptr)optionName;
  if ((this->m_suppressQ == 0) || (bVar1 = std::operator==(optionName,"options"), !bVar1)) {
    bVar1 = std::operator==((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                            it._M_node,"options");
    if (bVar1) {
      print(this,(ostream *)&std::cout);
      exit(0);
    }
    local_28._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::find(&this->m_optionList,it._M_node);
    local_30._M_node =
         (_Base_ptr)
         std::
         map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>_>
         ::end(&this->m_optionList);
    bVar1 = std::operator==(&local_28,&local_30);
    if (bVar1) {
      if (this->m_options_error_check != 0) {
        poVar2 = std::operator<<((ostream *)&std::cerr,"Error: unknown option \"");
        poVar2 = std::operator<<(poVar2,(string *)it._M_node);
        poVar2 = std::operator<<(poVar2,"\".");
        std::ostream::operator<<(poVar2,std::endl<char,std::char_traits<char>>);
        print(this,(ostream *)&std::cout);
        exit(1);
      }
      this_local._4_4_ = -1;
    }
    else {
      ppVar3 = std::
               _Rb_tree_iterator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
               ::operator->(&local_28);
      this_local._4_4_ = ppVar3->second;
    }
  }
  else {
    this_local._4_4_ = -1;
  }
  return this_local._4_4_;
}

Assistant:

int Options::getRegIndex(const std::string& optionName) {
   if (m_suppressQ && (optionName == "options")) {
         return -1;
   }

   if (optionName == "options") {
      print(std::cout);
      exit(0);
   }


   auto it = m_optionList.find(optionName);
   if (it == m_optionList.end()) {
      if (m_options_error_check) {
         std::cerr << "Error: unknown option \"" << optionName << "\"." << std::endl;
         print(std::cout);
         exit(1);
      } else {
         return -1;
      }
   } else {
      return it->second;
   }
}